

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * google::protobuf::internal::GetPrototypeForWeakDescriptor
                    (DescriptorTable *table,int index,bool force_build)

{
  char *__s;
  DescriptorPool *this;
  size_t sVar1;
  FileDescriptor *this_00;
  Descriptor *pDVar2;
  MessageFactory *pMVar3;
  Message *pMVar4;
  int i;
  int iVar5;
  string_view name;
  int local_2c;
  anon_class_8_1_a81517f2 local_28;
  undefined4 extraout_var;
  
  local_2c = index;
  InitProtobufDefaults();
  pMVar4 = table->default_instances[index];
  if (pMVar4 == (Message *)0x0 && force_build) {
    AssignDescriptors(table);
    this = DescriptorPool::internal_generated_pool();
    __s = table->filename;
    sVar1 = strlen(__s);
    name._M_str = __s;
    name._M_len = sVar1;
    this_00 = DescriptorPool::FindFileByName(this,name);
    local_28.index = &local_2c;
    iVar5 = 0;
    do {
      pDVar2 = (Descriptor *)0x0;
      if (this_00->message_type_count_ <= iVar5) break;
      pDVar2 = FileDescriptor::message_type(this_00,iVar5);
      pDVar2 = cpp::
               VisitDescriptorsInFileOrder<google::protobuf::internal::GetPrototypeForWeakDescriptor(google::protobuf::internal::DescriptorTable_const*,int,bool)::__0>
                         (pDVar2,&local_28);
      iVar5 = iVar5 + 1;
    } while (pDVar2 == (Descriptor *)0x0);
    pMVar3 = MessageFactory::generated_factory();
    iVar5 = (*pMVar3->_vptr_MessageFactory[2])(pMVar3,pDVar2);
    pMVar4 = (Message *)CONCAT44(extraout_var,iVar5);
  }
  return pMVar4;
}

Assistant:

const Message* GetPrototypeForWeakDescriptor(const DescriptorTable* table,
                                             int index, bool force_build) {
  // First, make sure we inject the surviving default instances.
  InitProtobufDefaults();

  // Now check if the table has it. If so, return it.
  if (const auto* msg = table->default_instances[index]) {
    return msg;
  }

  if (!force_build) {
    return nullptr;
  }

  // Fallback to dynamic messages.
  // Register the dep and generate the prototype via the generated pool.
  AssignDescriptors(table);

  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);

  const Descriptor* descriptor = internal::cpp::VisitDescriptorsInFileOrder(
      file, [&](auto* desc) -> const Descriptor* {
        if (index == 0) return desc;
        --index;
        return nullptr;
      });

  return MessageFactory::generated_factory()->GetPrototype(descriptor);
}